

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
amrex::StateDescriptor::sameInterps(StateDescriptor *this,int a_scomp,int a_ncomp)

{
  value_type *pvVar1;
  int in_ECX;
  int in_EDX;
  StateDescriptor *in_RSI;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RDI;
  int i;
  int NComp;
  int SComp;
  InterpBase *map;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *range;
  value_type *in_stack_ffffffffffffff88;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *pvVar2;
  pair<int,_int> local_54 [3];
  pair<int,_int> local_3c;
  int local_34;
  int local_30;
  int local_2c;
  value_type *local_28;
  undefined1 local_19;
  int local_18;
  int local_14;
  
  local_19 = 0;
  pvVar2 = in_RDI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x111f4e7);
  local_28 = (value_type *)interp(in_RSI,(int)((ulong)pvVar2 >> 0x20));
  local_2c = local_14;
  local_30 = 1;
  local_34 = local_14;
  while (local_34 = local_34 + 1, local_34 < local_14 + local_18) {
    in_stack_ffffffffffffff88 = local_28;
    pvVar1 = (value_type *)interp(in_RSI,(int)((ulong)pvVar2 >> 0x20));
    if (in_stack_ffffffffffffff88 == pvVar1) {
      local_30 = local_30 + 1;
    }
    else {
      std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_3c,&local_2c,&local_30);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                (in_RDI,in_stack_ffffffffffffff88);
      local_28 = (value_type *)interp(in_RSI,(int)((ulong)pvVar2 >> 0x20));
      local_2c = local_34;
      local_30 = 1;
    }
  }
  std::pair<int,_int>::pair<int_&,_int_&,_true>(local_54,&local_2c,&local_30);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            (in_RDI,in_stack_ffffffffffffff88);
  return pvVar2;
}

Assistant:

std::vector< std::pair<int,int> >
StateDescriptor::sameInterps (int a_scomp,
                              int a_ncomp) const
{
    BL_ASSERT(a_scomp >= 0);
    BL_ASSERT(a_ncomp >= 1);

    std::vector< std::pair<int,int> > range;

    InterpBase* map = interp(a_scomp);

    int SComp = a_scomp, NComp = 1;

    for (int i = a_scomp+1; i < a_scomp+a_ncomp; i++)
    {
        if (map == interp(i))
        {
            NComp++;
        }
        else
        {
            range.push_back(std::pair<int,int>(SComp,NComp));

            map   = interp(i);
            SComp = i;
            NComp = 1;
        }
    }

    range.push_back(std::pair<int,int>(SComp,NComp));

#ifdef AMREX_DEBUG
    int sum = 0;
    for (int i = 0; i < static_cast<int>(range.size()); i++)
        sum += range[i].second;
    BL_ASSERT(sum == a_ncomp);
#endif

    return range;
}